

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveErrorWarning(Parser *parser,int flags)

{
  int iVar1;
  CAssemblerCommand *this;
  undefined4 in_register_00000034;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  stringValue;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_38;
  bool local_18;
  
  getStringOrIdentifier_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38,(Parser *)CONCAT44(in_register_00000034,flags));
  if (local_18 == true) {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) {
      Logger::errorOnWarning = true;
      this = (CAssemblerCommand *)operator_new(0x18);
      this->_vptr_CAssemblerCommand = (_func_int **)0x0;
      this->FileNum = 0;
      this->FileLine = 0;
      *(undefined8 *)&this->section = 0;
      CAssemblerCommand::CAssemblerCommand(this);
LAB_0017dabb:
      this->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001bc968;
      goto LAB_0017dac5;
    }
    if (local_18 == true) {
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if (iVar1 == 0) {
        Logger::errorOnWarning = false;
        this = (CAssemblerCommand *)operator_new(0x18);
        this->_vptr_CAssemblerCommand = (_func_int **)0x0;
        this->FileNum = 0;
        this->FileLine = 0;
        *(undefined8 *)&this->section = 0;
        CAssemblerCommand::CAssemblerCommand(this);
        goto LAB_0017dabb;
      }
    }
  }
  this = (CAssemblerCommand *)0x0;
LAB_0017dac5:
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  if (local_18 == true) {
    local_18 = false;
    if (local_38._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_38._M_value + 0x10)) {
      operator_delete((void *)local_38._M_value._M_dataplus._M_p,local_38._16_8_ + 1);
    }
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveErrorWarning(Parser& parser, int flags)
{
	auto stringValue = getStringOrIdentifier(parser);
	if (!stringValue)
		return nullptr;

	if (stringValue == "on")
	{	
		Logger::setErrorOnWarning(true);
		return std::make_unique<DummyCommand>();
	} else if (stringValue == "off")
	{
		Logger::setErrorOnWarning(false);
		return std::make_unique<DummyCommand>();
	}

	return nullptr;
}